

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  pointer puVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  cmValue cVar5;
  ostream *poVar6;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  local_190._8_8_ = (prop->_M_dataplus)._M_p;
  local_190._0_8_ = prop->_M_string_length;
  __str._M_str = "LINK_INTERFACE_LIBRARIES";
  __str._M_len = 0x18;
  iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_190,0,0x18,__str);
  if (iVar4 == 0) {
    cVar5 = GetProperty(this,prop);
    if (cVar5.Value == (string *)0x0) {
      return;
    }
    bVar3 = false;
LAB_002f053a:
    anon_unknown.dwarf_d1bafb::CheckLINK_INTERFACE_LIBRARIES(prop,cVar5.Value,context,bVar3);
    return;
  }
  local_190._8_8_ = (prop->_M_dataplus)._M_p;
  local_190._0_8_ = prop->_M_string_length;
  __str_00._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES";
  __str_00._M_len = 0x21;
  iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_190,0,0x21,__str_00);
  if (iVar4 == 0) {
    cVar5 = GetProperty(this,prop);
    if (cVar5.Value == (string *)0x0) {
      return;
    }
    bVar3 = true;
    goto LAB_002f053a;
  }
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    cVar5 = GetProperty(this,prop);
    if (cVar5.Value == (string *)0x0) {
      return;
    }
    if (((anonymous_namespace)::
         CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
                                     ::keys), iVar4 != 0)) {
      (anonymous_namespace)::CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
      ::keys._176_8_ = 0;
      (anonymous_namespace)::CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
      ::keys._192_8_ = 0;
      (anonymous_namespace)::CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)
      ::keys._200_4_ = 0;
      memset((anonymous_namespace)::
             CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 (anonymous_namespace)::
                 CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                 "(^|;)(debug|optimized|general)(;|$)");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   (anonymous_namespace)::
                   CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::
                           keys);
    }
    bVar3 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       (anonymous_namespace)::
                       CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys,
                       ((cVar5.Value)->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)
                       (anonymous_namespace)::
                       CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys)
    ;
    if (!bVar3) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \"",0x45);
    if ((anonymous_namespace)::
        CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys._16_8_ == 0) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      local_1b0._M_string_length = 0;
      local_1b0.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 (anonymous_namespace)::
                 CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys._16_8_
                 ,(anonymous_namespace)::
                  CheckINTERFACE_LINK_LIBRARIES(std::__cxx11::string_const&,cmMakefile*)::keys.
                  _96_8_);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
               ,0x99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                               local_1b0.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_002f069b;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if (iVar4 != 0) {
      return;
    }
    if (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget != true)
    {
      return;
    }
    puVar8 = (context->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (context->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)puVar1 - (long)puVar8;
    if (0 < (long)uVar10 >> 5) {
      puVar7 = (pointer)((long)&(puVar8->_M_t).
                                super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t
                                .super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                                super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl +
                        (uVar10 & 0xffffffffffffffe0));
      lVar9 = ((long)uVar10 >> 5) + 1;
      puVar8 = puVar8 + 2;
      do {
        if (puVar8[-2]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
          puVar8 = puVar8 + -2;
          goto LAB_002f06ce;
        }
        if (puVar8[-1]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
          puVar8 = puVar8 + -1;
          goto LAB_002f06ce;
        }
        if ((puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) goto LAB_002f06ce;
        if (puVar8[1]._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl == this) {
          puVar8 = puVar8 + 1;
          goto LAB_002f06ce;
        }
        lVar9 = lVar9 + -1;
        puVar8 = puVar8 + 4;
      } while (1 < lVar9);
      uVar10 = (long)puVar1 - (long)puVar7;
      puVar8 = puVar7;
    }
    lVar9 = (long)uVar10 >> 3;
    if (lVar9 == 1) {
LAB_002f0605:
      if ((puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
          super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
        puVar8 = puVar1;
      }
LAB_002f06ce:
      if (puVar8 != puVar1) {
        return;
      }
    }
    else {
      if (lVar9 == 2) {
LAB_002f05fc:
        if ((puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
          puVar8 = puVar8 + 1;
          goto LAB_002f0605;
        }
        goto LAB_002f06ce;
      }
      if (lVar9 == 3) {
        if ((puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
            super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl != this) {
          puVar8 = puVar8 + 1;
          goto LAB_002f05fc;
        }
        goto LAB_002f06ce;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Attempt to promote imported target \"",0x24);
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,((_Var2._M_head_impl)->Name)._M_dataplus._M_p,
                        *(size_type *)((long)&(_Var2._M_head_impl)->Name + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
               ,0x54);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_002f069b;
  }
  operator_delete(local_1b0._M_dataplus._M_p,
                  CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                           local_1b0.field_2._M_local_buf[0]) + 1);
LAB_002f069b:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, false);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, true);
    }
  } else if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (cmValue value = this->GetProperty(prop)) {
      CheckINTERFACE_LINK_LIBRARIES(*value, context);
    }
  } else if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      CheckIMPORTED_GLOBAL(this, context);
    }
  }
}